

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

uchar * SOIL_load_image_from_memory
                  (uchar *buffer,int buffer_length,int *width,int *height,int *channels,
                  int force_channels)

{
  stbi_uc *psVar1;
  uchar *result;
  int force_channels_local;
  int *channels_local;
  int *height_local;
  int *width_local;
  int buffer_length_local;
  uchar *buffer_local;
  
  psVar1 = stbi_load_from_memory(buffer,buffer_length,width,height,channels,force_channels);
  if (psVar1 == (stbi_uc *)0x0) {
    result_string_pointer = stbi_failure_reason();
  }
  else {
    result_string_pointer = "Image loaded from memory";
  }
  return psVar1;
}

Assistant:

unsigned char*
	SOIL_load_image_from_memory
	(
		const unsigned char *const buffer,
		int buffer_length,
		int *width, int *height, int *channels,
		int force_channels
	)
{
	unsigned char *result = stbi_load_from_memory(
				buffer, buffer_length,
				width, height, channels,
				force_channels );
	if( result == NULL )
	{
		result_string_pointer = stbi_failure_reason();
	} else
	{
		result_string_pointer = "Image loaded from memory";
	}
	return result;
}